

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_goto_tb(DisasContext_conflict14 *ctx,int n,target_ulong_conflict dest)

{
  TCGContext_conflict9 *tcg_ctx_00;
  _Bool _Var1;
  TCGContext_conflict9 *tcg_ctx;
  target_ulong_conflict dest_local;
  int n_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  _Var1 = use_goto_tb(ctx,dest);
  if (_Var1) {
    tcg_gen_goto_tb_tricore(tcg_ctx_00,n);
    gen_save_pc(ctx,dest);
    tcg_gen_exit_tb_tricore(tcg_ctx_00,(TranslationBlock *)(ctx->base).tb,n);
  }
  else {
    gen_save_pc(ctx,dest);
    tcg_gen_lookup_and_goto_ptr_tricore(tcg_ctx_00);
  }
  return;
}

Assistant:

static inline void gen_goto_tb(DisasContext *s, int tb_num,
                               target_ulong pc, target_ulong npc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (use_goto_tb(s, pc, npc))  {
        /* jump to same page: we can use a direct jump */
        tcg_gen_goto_tb(tcg_ctx, tb_num);
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, pc);
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_npc, npc);
        tcg_gen_exit_tb(tcg_ctx, s->base.tb, tb_num);
    } else {
        /* jump to another page: currently not optimized */
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, pc);
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_npc, npc);
        tcg_gen_exit_tb(tcg_ctx, NULL, 0);
    }
}